

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetGamepadState(int jid,GLFWgamepadstate *state)

{
  int iVar1;
  _GLFWmapelement *p_Var2;
  float fVar3;
  uint bit_1;
  uint hat_1;
  float value_1;
  _GLFWmapelement *e_1;
  uint bit;
  uint hat;
  float value;
  _GLFWmapelement *e;
  _GLFWjoystick *js;
  int i;
  GLFWgamepadstate *state_local;
  int jid_local;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/glfw/src/input.c"
                  ,0x4d1,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  if (0xf < jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/glfw/src/input.c"
                  ,0x4d2,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  if (state == (GLFWgamepadstate *)0x0) {
    __assert_fail("state != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/glfw/src/input.c"
                  ,0x4d3,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  memset(state,0,0x28);
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    state_local._4_4_ = 0;
  }
  else if ((jid < 0) || (0xf < jid)) {
    _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)(uint)jid);
    state_local._4_4_ = 0;
  }
  else if (_glfw.joysticks[jid].present == 0) {
    state_local._4_4_ = 0;
  }
  else {
    iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + jid,3);
    if (iVar1 == 0) {
      state_local._4_4_ = 0;
    }
    else if (_glfw.joysticks[jid].mapping == (_GLFWmapping *)0x0) {
      state_local._4_4_ = 0;
    }
    else {
      for (js._4_4_ = 0; js._4_4_ < 0xf; js._4_4_ = js._4_4_ + 1) {
        p_Var2 = (_glfw.joysticks[jid].mapping)->buttons + js._4_4_;
        if (p_Var2->type == '\x01') {
          fVar3 = _glfw.joysticks[jid].axes[p_Var2->index] * (float)(int)p_Var2->axisScale +
                  (float)(int)p_Var2->axisOffset;
          if ((p_Var2->axisOffset < '\0') ||
             ((p_Var2->axisOffset == '\0' && ('\0' < p_Var2->axisScale)))) {
            if (0.0 <= fVar3) {
              state->buttons[js._4_4_] = '\x01';
            }
          }
          else if (fVar3 <= 0.0) {
            state->buttons[js._4_4_] = '\x01';
          }
        }
        else if (p_Var2->type == '\x03') {
          if ((_glfw.joysticks[jid].hats[(uint)((int)(uint)p_Var2->index >> 4)] &
              p_Var2->index & 0xf) != 0) {
            state->buttons[js._4_4_] = '\x01';
          }
        }
        else if (p_Var2->type == '\x02') {
          state->buttons[js._4_4_] = _glfw.joysticks[jid].buttons[p_Var2->index];
        }
      }
      for (js._4_4_ = 0; js._4_4_ < 6; js._4_4_ = js._4_4_ + 1) {
        p_Var2 = (_glfw.joysticks[jid].mapping)->axes + js._4_4_;
        if (p_Var2->type == '\x01') {
          fVar3 = _glfw_fmaxf(_glfw.joysticks[jid].axes[p_Var2->index] *
                              (float)(int)p_Var2->axisScale + (float)(int)p_Var2->axisOffset,-1.0);
          fVar3 = _glfw_fminf(fVar3,1.0);
          state->axes[js._4_4_] = fVar3;
        }
        else if (p_Var2->type == '\x03') {
          if ((_glfw.joysticks[jid].hats[(uint)((int)(uint)p_Var2->index >> 4)] &
              p_Var2->index & 0xf) == 0) {
            state->axes[js._4_4_] = -1.0;
          }
          else {
            state->axes[js._4_4_] = 1.0;
          }
        }
        else if (p_Var2->type == '\x02') {
          fVar3 = (float)_glfw.joysticks[jid].buttons[p_Var2->index];
          state->axes[js._4_4_] = fVar3 + fVar3 + -1.0;
        }
      }
      state_local._4_4_ = 1;
    }
  }
  return state_local._4_4_;
}

Assistant:

GLFWAPI int glfwGetGamepadState(int jid, GLFWgamepadstate* state)
{
    int i;
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(state != NULL);

    memset(state, 0, sizeof(GLFWgamepadstate));

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_ALL))
        return GLFW_FALSE;

    if (!js->mapping)
        return GLFW_FALSE;

    for (i = 0;  i <= GLFW_GAMEPAD_BUTTON_LAST;  i++)
    {
        const _GLFWmapelement* e = js->mapping->buttons + i;
        if (e->type == _GLFW_JOYSTICK_AXIS)
        {
            const float value = js->axes[e->index] * e->axisScale + e->axisOffset;
            // HACK: This should be baked into the value transform
            // TODO: Bake into transform when implementing output modifiers
            if (e->axisOffset < 0 || (e->axisOffset == 0 && e->axisScale > 0))
            {
                if (value >= 0.f)
                    state->buttons[i] = GLFW_PRESS;
            }
            else
            {
                if (value <= 0.f)
                    state->buttons[i] = GLFW_PRESS;
            }
        }
        else if (e->type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = e->index >> 4;
            const unsigned int bit = e->index & 0xf;
            if (js->hats[hat] & bit)
                state->buttons[i] = GLFW_PRESS;
        }
        else if (e->type == _GLFW_JOYSTICK_BUTTON)
            state->buttons[i] = js->buttons[e->index];
    }

    for (i = 0;  i <= GLFW_GAMEPAD_AXIS_LAST;  i++)
    {
        const _GLFWmapelement* e = js->mapping->axes + i;
        if (e->type == _GLFW_JOYSTICK_AXIS)
        {
            const float value = js->axes[e->index] * e->axisScale + e->axisOffset;
            state->axes[i] = _glfw_fminf(_glfw_fmaxf(value, -1.f), 1.f);
        }
        else if (e->type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = e->index >> 4;
            const unsigned int bit = e->index & 0xf;
            if (js->hats[hat] & bit)
                state->axes[i] = 1.f;
            else
                state->axes[i] = -1.f;
        }
        else if (e->type == _GLFW_JOYSTICK_BUTTON)
            state->axes[i] = js->buttons[e->index] * 2.f - 1.f;
    }

    return GLFW_TRUE;
}